

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O1

int __thiscall Js::TypePath::Add<false>(TypePath *this,PropertyRecord *propertyRecord)

{
  Type *pTVar1;
  Data *pDVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  
  pDVar2 = (this->data).ptr;
  if (pDVar2->pathLength != pDVar2->maxInitializedLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x128,"(this->GetPathLength() == this->GetMaxInitializedLength())",
                                "this->GetPathLength() == this->GetMaxInitializedLength()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pTVar1 = &((this->data).ptr)->maxInitializedLength;
  *pTVar1 = *pTVar1 + '\x01';
  iVar5 = AddInternal<true>(this,propertyRecord);
  return iVar5;
}

Assistant:

int Add(const PropertyRecord * propertyRecord)
        {
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Assert(this->GetPathLength() == this->GetMaxInitializedLength());
            this->GetData()->maxInitializedLength++;
#endif
            return AddInternal<!isSetter>(propertyRecord);
        }